

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O1

void CGL::Viewer::update(void)

{
  glClear(0x4100);
  if (renderer != (long *)0x0) {
    (**(code **)(*renderer + 0x18))();
  }
  if (showInfo == '\x01') {
    drawInfo();
  }
  glfwSwapBuffers(window);
  glfwPollEvents();
  return;
}

Assistant:

void Viewer::update() {
  
  // clear frame
  glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

  // run user renderer
  if (renderer) {
    renderer->render();
  }

  // draw info
  if( showInfo ) {
    drawInfo();        
  } 

  // swap buffers
  glfwSwapBuffers(window); 

  // poll events
  glfwPollEvents();
}